

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Gridded_Data_PDU::Encode(Gridded_Data_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  pointer pKVar4;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EnvProcID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16FieldNum);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PDUNum);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PDUTotal);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16CordSys);
  KDataStream::Write(stream,this->m_ui8NumAxis);
  KDataStream::Write(stream,this->m_ui8ConstGrid);
  (*(this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EnvType,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  KDataStream::Write<unsigned_long_long>(stream,this->m_ui64SampleTime);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32TotalValues);
  KDataStream::Write(stream,this->m_ui8VecDim);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding1);
  pKVar1 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vpGridAxisDesc).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar3->m_pRef,stream);
  }
  pKVar2 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vGridData).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar4->m_pRef,stream);
  }
  return;
}

Assistant:

void Gridded_Data_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EnvProcID
           << m_ui16FieldNum
           << m_ui16PDUNum
           << m_ui16PDUTotal
           << m_ui16CordSys
           << m_ui8NumAxis
           << m_ui8ConstGrid
           << KDIS_STREAM m_EnvType
           << KDIS_STREAM m_Ori
           << m_ui64SampleTime
           << m_ui32TotalValues
           << m_ui8VecDim
           << m_ui16Padding1
           << m_ui8Padding1;

    vector<GridAxisDescriptor>::const_iterator citrAxis = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrAxisEnd = m_vpGridAxisDesc.end();
    for( ; citrAxis != citrAxisEnd; ++citrAxis )
    {
        ( *citrAxis )->Encode( stream );
    }

    vector<GridDataPtr>::const_iterator citrData = m_vGridData.begin();
    vector<GridDataPtr>::const_iterator citrDataEnd = m_vGridData.end();
    for( ; citrData != citrDataEnd; ++citrData )
    {
        ( *citrData )->Encode( stream );
    }
}